

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler.hpp
# Opt level: O1

FailCodeType __thiscall
mittens::
GenericExceptionHandler<void,_mittens::GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/examples/2_custom_app_return_codes_with_messages.cpp:18:42)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/examples/2_custom_app_return_codes_with_messages.cpp:17:42)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/adishavit[P]mittens/examples/2_custom_app_return_codes_with_messages.cpp:16:42)>
::handleException(GenericExceptionHandler<void,_mittens::GenericExceptionHandler<std::exception,_mittens::GenericExceptionHandler<std::bad_alloc,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_examples_2_custom_app_return_codes_with_messages_cpp:18:42)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_examples_2_custom_app_return_codes_with_messages_cpp:17:42)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_examples_2_custom_app_return_codes_with_messages_cpp:16:42)>
                  *this)

{
  FailCodeType FVar1;
  
  FVar1 = UnHandler<int>::handleException
                    ((UnHandler<int> *)&(this->nestedHandler).nestedHandler.field_0x4);
  return FVar1;
}

Assistant:

FailCodeType handleException()
      {
         try
         {
            return nestedHandler();
         }
         catch (...)
         {            
            try 
            { 
               // Run custom action. 
               // If the return type of the custom action is the same as FailCodeType (as opposed to void or even less plausible something else)
               // then return the result of custom action as the fail code.
               using ReturnActionResult = typename std::is_same< FailCodeType, decltype(customAction_())>::type;
               return runAction(ReturnActionResult{});
            }
            catch (...) 
            { 
               // Force the action no-throw by suppressing any exceptions unless requested not to.
               if (!supressExceptionsInAction_)
                  throw; 
            } 
            return failCode_;
         }
      }